

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_doc(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,size_t id)

{
  size_t *psVar1;
  Tree *pTVar2;
  Tree *pTVar3;
  NodeType_e NVar4;
  code *pcVar5;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  bool bVar6;
  error_flags eVar7;
  size_t sVar8;
  csubstr *pcVar9;
  NodeScalar *pNVar10;
  
  pTVar2 = this->m_tree;
  if ((id == 0xffffffffffffffff) || (pTVar2->m_cap <= id)) {
    eVar7 = get_error_flags();
    if ((eVar7 & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
    }
    loc.super_LineCol.col = 0;
    loc.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc.name.str = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc.name.len = 0x65;
    yml::error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc);
  }
  if ((pTVar2->m_buf[id].m_type.type & DOC) == NOTYPE) {
    eVar7 = get_error_flags();
    if ((eVar7 & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
    }
    loc_00.super_LineCol.col = 0;
    loc_00.super_LineCol.offset = SUB168(ZEXT816(0x58a3) << 0x40,0);
    loc_00.super_LineCol.line = SUB168(ZEXT816(0x58a3) << 0x40,8);
    loc_00.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_00.name.len = 0x65;
    yml::error("check failed: m_tree->is_doc(id)",0x20,loc_00);
  }
  bVar6 = Tree::is_root(this->m_tree,id);
  if (!bVar6) {
    pTVar2 = this->m_tree;
    sVar8 = Tree::parent(pTVar2,id);
    if ((sVar8 == 0xffffffffffffffff) || (pTVar2->m_cap <= sVar8)) {
      eVar7 = get_error_flags();
      if ((eVar7 & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      loc_01.super_LineCol.col = 0;
      loc_01.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_01.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_01.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_01.name.len = 0x65;
      yml::error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_01);
    }
    if ((~(int)pTVar2->m_buf[sVar8].m_type.type & 0x28U) != 0) {
      eVar7 = get_error_flags();
      if ((eVar7 & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      loc_02.super_LineCol.col = 0;
      loc_02.super_LineCol.offset = SUB168(ZEXT816(0x58a6) << 0x40,0);
      loc_02.super_LineCol.line = SUB168(ZEXT816(0x58a6) << 0x40,8);
      loc_02.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_02.name.len = 0x65;
      yml::error("check failed: m_tree->is_stream(m_tree->parent(id))",0x33,loc_02);
    }
    std::ostream::write((char *)((this->
                                 super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ).m_stream + 0x10),0x1fe383);
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 3;
  }
  pTVar2 = this->m_tree;
  if ((id == 0xffffffffffffffff) || (pTVar2->m_cap <= id)) {
    eVar7 = get_error_flags();
    if ((eVar7 & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar5 = (code *)swi(3);
        (*pcVar5)();
        return;
      }
    }
    loc_03.super_LineCol.col = 0;
    loc_03.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_03.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_03.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    loc_03.name.len = 0x65;
    yml::error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_03);
  }
  pTVar3 = this->m_tree;
  bVar6 = pTVar3->m_cap <= id;
  if ((pTVar2->m_buf[id].m_type.type & VAL) == NOTYPE) {
    if (bVar6 || id == 0xffffffffffffffff) {
      eVar7 = get_error_flags();
      if ((eVar7 & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      loc_04.super_LineCol.col = 0;
      loc_04.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_04.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_04.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_04.name.len = 0x65;
      yml::error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_04);
    }
    NVar4 = pTVar3->m_buf[id].m_type.type;
    if ((NVar4 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar4 >> 0xb & 1) != 0) {
      bVar6 = Tree::is_root(this->m_tree,id);
      if (!bVar6) {
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream + '\x10');
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
      }
      pcVar9 = Tree::val_tag(this->m_tree,id);
      _write_tag(this,*pcVar9);
    }
    pTVar2 = this->m_tree;
    if ((id == 0xffffffffffffffff) || (pTVar2->m_cap <= id)) {
      eVar7 = get_error_flags();
      if ((eVar7 & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      loc_05.super_LineCol.col = 0;
      loc_05.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_05.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_05.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_05.name.len = 0x65;
      yml::error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_05);
    }
    NVar4 = pTVar2->m_buf[id].m_type.type;
    if ((NVar4 & (SEQ|MAP|VAL)) != NOTYPE && ((uint)NVar4 >> 9 & 1) != 0) {
      bVar6 = Tree::is_root(this->m_tree,id);
      if (!bVar6) {
        std::ostream::put((char)(this->
                                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream + '\x10');
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + 1;
      }
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + 1;
      pcVar9 = Tree::val_anchor(this->m_tree,id);
      sVar8 = pcVar9->len;
      if (pcVar9->str != (char *)0x0 && sVar8 != 0) {
        std::ostream::write((char *)((this->
                                     super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ).m_stream + 0x10),(long)pcVar9->str);
        psVar1 = &(this->
                  super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar1 = *psVar1 + sVar8;
      }
    }
  }
  else {
    if (bVar6 || id == 0xffffffffffffffff) {
      eVar7 = get_error_flags();
      if ((eVar7 & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      loc_06.super_LineCol.col = 0;
      loc_06.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_06.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_06.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_06.name.len = 0x65;
      yml::error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_06);
    }
    if ((pTVar3->m_buf[id].m_type.type & VAL) == NOTYPE) {
      eVar7 = get_error_flags();
      if ((eVar7 & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      loc_07.super_LineCol.col = 0;
      loc_07.super_LineCol.offset = SUB168(ZEXT816(0x58bb) << 0x40,0);
      loc_07.super_LineCol.line = SUB168(ZEXT816(0x58bb) << 0x40,8);
      loc_07.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_07.name.len = 0x65;
      yml::error("check failed: m_tree->has_val(id)",0x21,loc_07);
    }
    pTVar2 = this->m_tree;
    if ((id == 0xffffffffffffffff) || (pTVar2->m_cap <= id)) {
      eVar7 = get_error_flags();
      if ((eVar7 & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      loc_08.super_LineCol.col = 0;
      loc_08.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_08.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_08.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_08.name.len = 0x65;
      yml::error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_08);
    }
    if ((pTVar2->m_buf[id].m_type.type & KEY) != NOTYPE) {
      eVar7 = get_error_flags();
      if ((eVar7 & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      loc_09.super_LineCol.col = 0;
      loc_09.super_LineCol.offset = SUB168(ZEXT816(0x58bc) << 0x40,0);
      loc_09.super_LineCol.line = SUB168(ZEXT816(0x58bc) << 0x40,8);
      loc_09.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_09.name.len = 0x65;
      yml::error("check failed: !m_tree->has_key(id)",0x22,loc_09);
    }
    bVar6 = Tree::is_root(this->m_tree,id);
    if (!bVar6) {
      std::ostream::put((char)(this->
                              super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ).m_stream + '\x10');
      psVar1 = &(this->
                super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ).m_pos;
      *psVar1 = *psVar1 + 1;
    }
    pNVar10 = Tree::valsc(this->m_tree,id);
    pTVar2 = this->m_tree;
    if ((id == 0xffffffffffffffff) || (pTVar2->m_cap <= id)) {
      eVar7 = get_error_flags();
      if ((eVar7 & 1) != 0) {
        bVar6 = is_debugger_attached();
        if (bVar6) {
          pcVar5 = (code *)swi(3);
          (*pcVar5)();
          return;
        }
      }
      loc_10.super_LineCol.col = 0;
      loc_10.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_10.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_10.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      loc_10.name.len = 0x65;
      yml::error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_10);
    }
    _write(this,(int)pNVar10,(void *)(ulong)((uint)pTVar2->m_buf[id].m_type.type & 0x5541281),0);
  }
  std::ostream::put((char)(this->
                          super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ).m_stream + '\x10');
  psVar1 = &(this->
            super_WriterOStream<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void Emitter<Writer>::_write_doc(size_t id)
{
    RYML_ASSERT(m_tree->is_doc(id));
    if(!m_tree->is_root(id))
    {
        RYML_ASSERT(m_tree->is_stream(m_tree->parent(id)));
        this->Writer::_do_write("---");
    }
    if(!m_tree->has_val(id)) // this is more frequent
    {
        if(m_tree->has_val_tag(id))
        {
            if(!m_tree->is_root(id))
                this->Writer::_do_write(' ');
            _write_tag(m_tree->val_tag(id));
        }
        if(m_tree->has_val_anchor(id))
        {
            if(!m_tree->is_root(id))
                this->Writer::_do_write(' ');
            this->Writer::_do_write('&');
            this->Writer::_do_write(m_tree->val_anchor(id));
        }
    }
    else // docval
    {
        RYML_ASSERT(m_tree->has_val(id));
        RYML_ASSERT(!m_tree->has_key(id));
        if(!m_tree->is_root(id))
            this->Writer::_do_write(' ');
        _writev(id, 0);
    }
    this->Writer::_do_write('\n');
}